

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O1

uint64_t scale_counts(vector<unsigned_int,_std::allocator<unsigned_int>_> *F,size_t maxv,int silent)

{
  long lVar1;
  pointer puVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar20 [64];
  undefined1 in_XMM5 [16];
  undefined1 auVar12 [32];
  
  if (maxv == 0) {
    dVar18 = 0.0;
  }
  else {
    puVar2 = (F->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    auVar15 = vpbroadcastq_avx512f();
    auVar20 = ZEXT1664((undefined1  [16])0x0);
    uVar7 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar14 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
    do {
      auVar17 = vmovdqa64_avx512f(auVar20);
      auVar20 = vpbroadcastq_avx512f();
      auVar20 = vporq_avx512f(auVar20,auVar16);
      uVar5 = vpcmpuq_avx512f(auVar20,auVar15,2);
      auVar12 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(puVar2 + uVar7 + 1));
      auVar13._4_4_ = (uint)((byte)(uVar5 >> 1) & 1) * auVar12._4_4_;
      auVar13._0_4_ = (uint)((byte)uVar5 & 1) * auVar12._0_4_;
      auVar13._8_4_ = (uint)((byte)(uVar5 >> 2) & 1) * auVar12._8_4_;
      auVar13._12_4_ = (uint)((byte)(uVar5 >> 3) & 1) * auVar12._12_4_;
      auVar13._16_4_ = (uint)((byte)(uVar5 >> 4) & 1) * auVar12._16_4_;
      auVar13._20_4_ = (uint)((byte)(uVar5 >> 5) & 1) * auVar12._20_4_;
      auVar13._24_4_ = (uint)((byte)(uVar5 >> 6) & 1) * auVar12._24_4_;
      auVar13._28_4_ = (uint)(byte)(uVar5 >> 7) * auVar12._28_4_;
      auVar13 = vpaddd_avx2(auVar13,auVar14);
      auVar12 = vmovdqu32_avx512vl(auVar13);
      *(undefined1 (*) [32])(puVar2 + uVar7 + 1) = auVar12;
      auVar20 = vpmovzxdq_avx512f(auVar13);
      auVar20 = vpaddq_avx512f(auVar17,auVar20);
      uVar7 = uVar7 + 8;
    } while ((maxv + 7 & 0xfffffffffffffff8) != uVar7);
    auVar15 = vmovdqa64_avx512f(auVar20);
    bVar3 = (bool)((byte)uVar5 & 1);
    auVar16._0_8_ = (ulong)bVar3 * auVar15._0_8_ | (ulong)!bVar3 * auVar17._0_8_;
    bVar3 = (bool)((byte)(uVar5 >> 1) & 1);
    auVar16._8_8_ = (ulong)bVar3 * auVar15._8_8_ | (ulong)!bVar3 * auVar17._8_8_;
    bVar3 = (bool)((byte)(uVar5 >> 2) & 1);
    auVar16._16_8_ = (ulong)bVar3 * auVar15._16_8_ | (ulong)!bVar3 * auVar17._16_8_;
    bVar3 = (bool)((byte)(uVar5 >> 3) & 1);
    auVar16._24_8_ = (ulong)bVar3 * auVar15._24_8_ | (ulong)!bVar3 * auVar17._24_8_;
    bVar3 = (bool)((byte)(uVar5 >> 4) & 1);
    auVar16._32_8_ = (ulong)bVar3 * auVar15._32_8_ | (ulong)!bVar3 * auVar17._32_8_;
    bVar3 = (bool)((byte)(uVar5 >> 5) & 1);
    auVar16._40_8_ = (ulong)bVar3 * auVar15._40_8_ | (ulong)!bVar3 * auVar17._40_8_;
    bVar3 = (bool)((byte)(uVar5 >> 6) & 1);
    auVar16._48_8_ = (ulong)bVar3 * auVar15._48_8_ | (ulong)!bVar3 * auVar17._48_8_;
    auVar16._56_8_ = (uVar5 >> 7) * auVar15._56_8_ | (ulong)!SUB81(uVar5 >> 7,0) * auVar17._56_8_;
    auVar14 = vextracti64x4_avx512f(auVar16,1);
    auVar15 = vpaddq_avx512f(auVar16,ZEXT3264(auVar14));
    auVar4 = vpaddq_avx(auVar15._0_16_,auVar15._16_16_);
    auVar19 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddq_avx(auVar4,auVar19);
    auVar4 = vcvtusi2sd_avx512f(in_XMM5,auVar4._0_8_);
    dVar18 = auVar4._0_8_;
  }
  if (maxv == 0) {
    iVar6 = 0;
    lVar8 = 1;
  }
  else {
    puVar2 = (F->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = 1;
    iVar6 = 0;
    lVar10 = 1;
    do {
      auVar4 = vcvtusi2sd_avx512f(in_XMM5,puVar2[lVar9]);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = (2147483648.0 / dVar18) * auVar4._0_8_;
      uVar11 = vcvttsd2usi_avx512f(auVar19);
      puVar2[lVar9] = uVar11;
      lVar8 = lVar9;
      if (uVar11 <= puVar2[lVar10]) {
        lVar8 = lVar10;
      }
      iVar6 = iVar6 + uVar11;
      lVar1 = (1 - maxv) + lVar9;
      lVar9 = lVar9 + 1;
      lVar10 = lVar8;
    } while (lVar1 != 1);
  }
  puVar2 = (F->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2[lVar8] = (puVar2[lVar8] - iVar6) + 0x80000000;
  return 0x80000000;
}

Assistant:

uint64_t scale_counts(std::vector<uint32_t>& F, size_t maxv, int silent)
{
    size_t power;
    double ratio;
    size_t maxsym;
    uint64_t total;
    int i;
    power = TBTS;
    total = 0;
    for (i = 1; i <= maxv; i++) {
        /* shift from 1-origin back to 0-origin */
        F[i]--;
        total += F[i];
    }
    ratio = ((double)(1LL << power)) / total;

    /* do the adjustment, tracking the new total and also locating the
       most probable symbol */
    maxsym = 1;
    total = 0;
    for (i = 1; i <= maxv; i++) {
        /* these are still offset by 1 after the interp step */
        F[i] = F[i] * ratio;
        total += F[i];
        if (F[i] > F[maxsym]) {
            maxsym = i;
        }
    }
    /* allocate the leftover remainder as a bonus to the MFS */
    F[maxsym] += (1LL << power) - total;
    return (1LL << power);
}